

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPTCPTransmitter::DeleteDestination(RTPTCPTransmitter *this,RTPAddress *addr)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  RTPMemoryManager *pRVar4;
  int iVar5;
  _Base_ptr p_Var6;
  iterator __position;
  
  iVar5 = -0xb5;
  if (((this->m_init == true) && (iVar5 = -0xbb, this->m_created == true)) &&
     (iVar5 = -0xbc, addr->addresstype == TCPAddress)) {
    iVar5 = *(int *)&addr->field_0xc;
    if (iVar5 != 0) {
      p_Var1 = &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < iVar5])
      {
        if (iVar5 <= (int)p_Var2[1]._M_color) {
          p_Var6 = p_Var2;
        }
      }
      __position._M_node = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (__position._M_node = p_Var6, iVar5 < (int)p_Var6[1]._M_color)) {
        __position._M_node = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)__position._M_node == p_Var1) {
        iVar5 = -0xc3;
      }
      else {
        p_Var3 = __position._M_node[1]._M_right;
        __position._M_node[1]._M_right = (_Base_ptr)0x0;
        if (p_Var3 != (_Base_ptr)0x0) {
          pRVar4 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          if (pRVar4 == (RTPMemoryManager *)0x0) {
            operator_delete__(p_Var3);
          }
          else {
            (**(code **)(*(long *)pRVar4 + 0x18))();
          }
        }
        std::
        _Rb_tree<int,std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>,std::_Select1st<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>,std::less<int>,std::allocator<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>>
        ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>,std::_Select1st<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>,std::less<int>,std::allocator<std::pair<int_const,jrtplib::RTPTCPTransmitter::SocketData>>>
                            *)&this->m_destSockets,__position);
        iVar5 = 0;
      }
      return iVar5;
    }
    iVar5 = -0xbd;
  }
  return iVar5;
}

Assistant:

int RTPTCPTransmitter::DeleteDestination(const RTPAddress &addr)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	
	if (addr.GetAddressType() != RTPAddress::TCPAddress)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_INVALIDADDRESSTYPE;
	}

	const RTPTCPAddress &a = static_cast<const RTPTCPAddress &>(addr);
	SocketType s = a.GetSocket();
	if (s == 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOSOCKETSPECIFIED;
	}

	std::map<SocketType, SocketData>::iterator it = m_destSockets.find(s);
	if (it == m_destSockets.end())
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SOCKETNOTFOUNDINDESTINATIONS;
	}

	// Clean up possibly allocated memory
	uint8_t *pBuf = it->second.ExtractDataBuffer();
	if (pBuf)
		RTPDeleteByteArray(pBuf, GetMemoryManager());

	m_destSockets.erase(it);

	MAINMUTEX_UNLOCK
	return 0;
}